

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O3

int GetLatestDataHokuyox(HOKUYO *pHokuyo,double *pDistances,double *pAngles)

{
  int iVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  uint uVar6;
  char *databuf_00;
  char databuf [8192];
  int local_202c;
  char local_2028 [8200];
  
  databuf_00 = local_2028;
  memset(databuf_00,0,0x2000);
  local_202c = 0;
  iVar2 = GetLatestHokuyoMessageHokuyo(pHokuyo,databuf_00,0x2000,&local_202c);
  iVar3 = 1;
  if (iVar2 == 0) {
    iVar3 = 0;
    if (0 < local_202c) {
      iVar2 = pHokuyo->SlitDivision;
      iVar3 = pHokuyo->StartingStep;
      iVar1 = pHokuyo->FrontStep;
      uVar4 = 0;
      do {
        pAngles[uVar4] =
             ((double)((iVar3 - iVar1) + iVar2 / 2 + (int)uVar4) * pHokuyo->StepAngleSize *
             3.141592653589793) / 180.0 + -3.141592653589793;
        lVar5 = 0;
        uVar6 = 0;
        do {
          uVar6 = (int)databuf_00[lVar5] - 0x30U | uVar6 << 6;
          lVar5 = lVar5 + 1;
        } while (lVar5 != 3);
        pDistances[uVar4] = (double)(int)uVar6 / 1000.0;
        uVar4 = uVar4 + 1;
        databuf_00 = databuf_00 + 3;
      } while (uVar4 != (local_202c - 1U) / 3 + 1);
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

HARDWAREX_API int GetLatestDataHokuyox(HOKUYO* pHokuyo, double* pDistances, double* pAngles)
{
	return GetLatestDataHokuyo(pHokuyo, pDistances, pAngles);
}